

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O2

String * kj::_::operator*(String *__return_storage_ptr__,long *param_2,undefined8 param_3,
                         undefined8 param_4,ArrayPtr<const_char> *param_5)

{
  long lVar1;
  ArrayPtr<const_char> local_38;
  long local_28;
  long local_20;
  
  lVar1 = param_2[1];
  local_28 = lVar1;
  if (lVar1 != 0) {
    local_28 = *param_2;
  }
  local_20 = 0;
  if (lVar1 != 0) {
    local_20 = lVar1 + -1;
  }
  local_38 = toCharSequence<char_const(&)[4]>((char (*) [4])param_2[3]);
  concat<kj::ArrayPtr<char_const>,kj::StringPtr&,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)&local_28,(ArrayPtr<const_char> *)(param_2 + 4),
             (StringPtr *)&local_38,param_5);
  return __return_storage_ptr__;
}

Assistant:

String KJ_STRINGIFY(DebugComparison<Left, Right>& cmp) {
  return _::concat(tryToCharSequence(&cmp.left), cmp.op, tryToCharSequence(&cmp.right));
}